

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

VmConstant *
GetLoadRegisterAndOffset
          (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock,
          VmValue *address,VmValue *offset,uchar *addressReg)

{
  uchar uVar1;
  VmConstant *pVVar2;
  
  if ((offset == (VmValue *)0x0) || (offset->typeID != 1)) {
    offset = (VmValue *)0x0;
  }
  pVVar2 = GetAddressInContainer(address);
  if (pVVar2 == (VmConstant *)0x0) {
    uVar1 = GetArgumentRegister(ctx,lowFunction,lowBlock,address);
  }
  else {
    if (((VmConstant *)offset)->iValue != 0) {
      __assert_fail("constantOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x280,
                    "VmConstant *GetLoadRegisterAndOffset(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmValue *, VmValue *, unsigned char &)"
                   );
    }
    uVar1 = IsLocalScope(pVVar2->container->scope);
    offset = &pVVar2->super_VmValue;
  }
  *addressReg = uVar1;
  return (VmConstant *)offset;
}

Assistant:

VmConstant* GetLoadRegisterAndOffset(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmValue *address, VmValue *offset, unsigned char &addressReg)
{
	VmConstant *constantOffset = getType<VmConstant>(offset);

	if(VmConstant *constant = GetAddressInContainer(address))
	{
		assert(constantOffset->iValue == 0);

		addressReg = IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals;

		return constant;
	}

	addressReg = GetArgumentRegister(ctx, lowFunction, lowBlock, address);

	return constantOffset;
}